

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::draw_hud(Application *this)

{
  Color *c;
  bool bVar1;
  pointer piVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  pointer pbVar6;
  float fVar7;
  float x;
  float fVar8;
  undefined4 uVar9;
  float local_130;
  string s1;
  string s2;
  Info selectionInfo;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  OSDText::clear(&this->textManager);
  piVar2 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar2) {
    (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  bVar1 = (this->super_Renderer).use_hdpi;
  lVar5 = -300;
  if (bVar1 == false) {
    fVar7 = 24.0;
    local_130 = 72.0;
  }
  else {
    lVar5 = -600;
    fVar7 = 48.0;
    local_130 = 160.0;
  }
  x = (float)(lVar5 + this->screenW);
  bVar4 = DynamicScene::Scene::has_selection(this->scene);
  if (bVar4) {
    DynamicScene::Scene::getSelectionInfo_abi_cxx11_(&selectionInfo,this->scene);
    c = &this->text_color;
    for (pbVar6 = selectionInfo.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != selectionInfo.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      lVar5 = std::__cxx11::string::find_first_of((char *)pbVar6,0x1e5aa4);
      if (lVar5 == -1) {
        std::__cxx11::string::string((string *)&local_90,(string *)pbVar6);
        draw_string(this,x,local_130,&local_90,0x10,c);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::substr((ulong)&s1,(ulong)pbVar6);
        std::__cxx11::string::substr((ulong)&s2,(ulong)pbVar6);
        std::__cxx11::string::string((string *)&local_50,(string *)&s1);
        draw_string(this,x,local_130,&local_50,0x10,c);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = (this->super_Renderer).use_hdpi;
        std::__cxx11::string::string((string *)&local_70,(string *)&s2);
        fVar8 = 150.0;
        if (bVar4 == false) {
          fVar8 = 75.0;
        }
        draw_string(this,fVar8 + x,local_130,&local_70,0x10,c);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&s2);
        std::__cxx11::string::~string((string *)&s1);
      }
      local_130 = local_130 + fVar7;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&selectionInfo);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"No mesh feature is selected",(allocator<char> *)&s1);
    draw_string(this,x,local_130,&local_b0,0x10,&this->text_color);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar1 == false) {
      local_130 = 96.0;
    }
    else {
      local_130 = 208.0;
    }
  }
  glPushAttrib(0x800);
  glViewport(0,0,(int)this->screenW,(int)this->screenH);
  glMatrixMode(0x1701);
  glPushMatrix();
  glLoadIdentity();
  glOrtho(0,((double)CONCAT44(0x45300000,(int)(this->screenW >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->screenW) - 4503599627370496.0),
          ((double)CONCAT44(0x45300000,(int)(this->screenH >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)this->screenH) - 4503599627370496.0),0,0,
          0x3ff0000000000000);
  glMatrixMode(0x1700);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0,0,0xbf800000);
  glColor4f(0,0,0,0x3f4ccccd);
  if (bVar1 == false) {
    uVar9 = 0x42000000;
  }
  else {
    uVar9 = 0x42c00000;
  }
  uVar3 = this->screenW;
  glDisable(0xb71);
  glDisable(0xb50);
  glBegin(7);
  glVertex3f(x + -32.0,uVar9,0);
  glVertex3f(x + -32.0,local_130,0);
  glVertex3f((float)uVar3,local_130,0);
  glVertex3f((float)uVar3,uVar9,0);
  glEnd();
  glMatrixMode(0x1701);
  glPopMatrix();
  glMatrixMode(0x1700);
  glPopMatrix();
  glPopAttrib();
  glEnable(0xb50);
  glEnable(0xb71);
  OSDText::render(&this->textManager);
  return;
}

Assistant:

void Application::draw_hud() {
  textManager.clear();
  messages.clear();

  const size_t size = 16;
  const float x0 = use_hdpi ? screenW - 300 * 2 : screenW - 300;
  const float y0 = use_hdpi ? 128 : 64;
  const int inc  = use_hdpi ? 48  : 24;
  float y = y0 + inc - size;

  // No selection --> no messages.
  if (!scene->has_selection()) {
    draw_string(x0, y, "No mesh feature is selected", size, text_color);
    y += inc;
  } else {
    Info selectionInfo = scene->getSelectionInfo();
    for (const string& s : selectionInfo) {
      size_t split = s.find_first_of(":");
      if (split != string::npos) {
        split++;
        string s1 = s.substr(0,split);
        string s2 = s.substr(split);
        draw_string(x0, y, s1, size, text_color);
        draw_string(x0 + (use_hdpi ? 150 : 75 ), y, s2, size, text_color);
      } else {
        draw_string(x0, y, s, size, text_color);
      }
      y += inc;
    }
  }

  // -- First draw a lovely black rectangle.

  glPushAttrib(GL_VIEWPORT_BIT);
  glViewport(0, 0, screenW, screenH);

  glMatrixMode(GL_PROJECTION);
  glPushMatrix();
  glLoadIdentity();
  glOrtho(0, screenW, screenH, 0, 0, 1);

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0, 0, -1);

  // -- Black with opacity .8;

  glColor4f(0.0, 0.0, 0.0, 0.8);

  float min_x = x0 - 32;
  float min_y = y0 - 32;
  float max_x = screenW;
  float max_y = y;

  float z = 0.0;

  glDisable(GL_DEPTH_TEST);
  glDisable(GL_LIGHTING);

  glBegin(GL_QUADS);

  glVertex3f(min_x, min_y, z);
  glVertex3f(min_x, max_y, z);
  glVertex3f(max_x, max_y, z);
  glVertex3f(max_x, min_y, z);
  glEnd();

  glMatrixMode(GL_PROJECTION);
  glPopMatrix();

  glMatrixMode(GL_MODELVIEW);
  glPopMatrix();

  glPopAttrib();

  glEnable(GL_LIGHTING);
  glEnable(GL_DEPTH_TEST);

  textManager.render();
}